

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O1

void __thiscall
OptionParser::parseEnergyOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *s1;
  string *s1_00;
  pointer pcVar2;
  bool bVar3;
  int value_00;
  InputError *pIVar4;
  ValueOption option;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  double local_38;
  double value;
  
  s1_00 = (tokenList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (0x40 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)s1_00)) {
    paVar1 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"GLOBAL","");
    bVar3 = Utilities::match(s1_00,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (bVar3) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PRICE","");
      s1 = s1_00 + 1;
      bVar3 = Utilities::match(s1,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (bVar3) {
        bVar3 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
        if (!bVar3) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          pcVar2 = s1_00[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,pcVar2,pcVar2 + s1_00[2]._M_string_length);
          InputError::InputError(pIVar4,6,&local_118);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        option = ENERGY_PRICE;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PATTERN","");
        bVar3 = Utilities::match(s1,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (bVar3) {
          value_00 = Network::indexOf(network,PATTERN,s1_00 + 2);
          if (-1 < value_00) {
            Options::setOption(&network->options,ENERGY_PRICE_PATTERN,value_00);
            return;
          }
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          pcVar2 = s1_00[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,pcVar2,pcVar2 + s1_00[2]._M_string_length);
          InputError::InputError(pIVar4,5,&local_f8);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EFFIC","");
        bVar3 = Utilities::match(s1,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if (!bVar3) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          pcVar2 = s1_00[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar2,pcVar2 + s1_00[1]._M_string_length);
          InputError::InputError(pIVar4,3,&local_b8);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        bVar3 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
        if (!bVar3) {
          pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar2 = s1_00[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,pcVar2,pcVar2 + s1_00[2]._M_string_length);
          InputError::InputError(pIVar4,6,&local_d8);
          __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
        }
        option = PUMP_EFFICIENCY;
      }
    }
    else {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"DEMAND","");
      bVar3 = Utilities::match(s1_00,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = (s1_00->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + s1_00->_M_string_length);
        InputError::InputError(pIVar4,3,&local_78);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
      bVar3 = Utilities::parseNumber<double>(s1_00 + 2,&local_38);
      if (!bVar3) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        pcVar2 = s1_00[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar2,pcVar2 + s1_00[2]._M_string_length);
        InputError::InputError(pIVar4,6,&local_98);
        __cxa_throw(pIVar4,&InputError::typeinfo,ENerror::~ENerror);
      }
      option = PEAKING_CHARGE;
    }
    Options::setOption(&network->options,option,local_38);
  }
  return;
}

Assistant:

void OptionParser::parseEnergyOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) return;
    string* tokens = &tokenList[0];
    double value;

    // ... check for global energy options

    if (Utilities::match(tokens[0], w_GLOBAL))
    {
        // ... global price per kwh

        if (Utilities::match(tokens[1], w_PRICE))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::ENERGY_PRICE, value);
        }

        // ... global time of day price pattern

        else if (Utilities::match(tokens[1], w_PATTERN))
        {
            int j = network->indexOf(Element::PATTERN, tokens[2]);
            if (j < 0) throw InputError(InputError::UNDEFINED_OBJECT, tokens[2]);
            network->options.setOption(Options::ENERGY_PRICE_PATTERN, j);
        }

        // ... global pump efficiency

        else if (Utilities::match(tokens[1], w_EFFIC))
        {
            if ( !Utilities::parseNumber(tokens[2], value) )
            {
                throw InputError(InputError::INVALID_NUMBER, tokens[2]);
            }
            network->options.setOption(Options::PUMP_EFFICIENCY, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... peak demand charge

    else if (Utilities::match(tokens[0], w_DEMAND))
    {
        if ( !Utilities::parseNumber(tokens[2], value) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[2]);
        }
        network->options.setOption(Options::PEAKING_CHARGE, value);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}